

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionHandler::handleUnexpectedInflightException(AssertionHandler *this)

{
  IResultCapture *pIVar1;
  string asStack_38 [32];
  
  pIVar1 = this->m_resultCapture;
  translateActiveException_abi_cxx11_();
  (*pIVar1->_vptr_IResultCapture[0xd])(pIVar1,this,asStack_38,&this->m_reaction);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void AssertionHandler::handleUnexpectedInflightException() {
    m_resultCapture.handleUnexpectedInflightException(m_assertionInfo, Catch::translateActiveException(), m_reaction);
  }